

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

MoleculeStampSet * __thiscall
OpenMD::SelectionManager::getSelectedMoleculeStamps(SelectionManager *this)

{
  bool bVar1;
  set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
  *this_00;
  reference ppMVar2;
  long in_RSI;
  MoleculeStampSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<OpenMD::MoleculeStamp_*>,_bool> pVar3;
  Molecule *mol;
  size_t i;
  MoleculeStampSet *moleculeStamps;
  int in_stack_ffffffffffffff6c;
  _Rb_tree_const_iterator<OpenMD::MoleculeStamp_*> in_stack_ffffffffffffff70;
  set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
  *__x;
  set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
  *local_20;
  
  std::
  set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
  ::set((set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
         *)0x38036e);
  local_20 = (set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
              *)0x0;
  while( true ) {
    __x = local_20;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RSI + 8),5
              );
    this_00 = (set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
               *)OpenMDBitSet::size((OpenMDBitSet *)0x38039c);
    if (this_00 <= __x) break;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RSI + 8),5
              );
    bVar1 = OpenMDBitSet::operator[]
                      ((OpenMDBitSet *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff6c);
    if ((bVar1) &&
       (ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                             (in_RSI + 0xb0),(size_type)local_20), *ppMVar2 != (value_type)0x0)) {
      ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                          ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                           (in_RSI + 0xb0),(size_type)local_20);
      Molecule::getMolStamp(*ppMVar2);
      pVar3 = std::
              set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
              ::insert(this_00,(value_type *)__x);
      in_stack_ffffffffffffff70 = pVar3.first._M_node;
      in_stack_ffffffffffffff6c = CONCAT13(pVar3.second,(int3)in_stack_ffffffffffffff6c);
    }
    local_20 = (set<OpenMD::MoleculeStamp_*,_OpenMD::MoleculeStampCompare,_std::allocator<OpenMD::MoleculeStamp_*>_>
                *)&(local_20->_M_t)._M_impl.field_0x1;
  }
  return in_RDI;
}

Assistant:

MoleculeStampSet SelectionManager::getSelectedMoleculeStamps() {
    MoleculeStampSet moleculeStamps;

    for (size_t i = 0; i < ss_.bitsets_[MOLECULE].size(); ++i) {
      if (ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) {
          Molecule* mol = static_cast<Molecule*>(molecules_[i]);
          moleculeStamps.insert(mol->getMolStamp());
        }
      }
    }

#ifdef IS_MPI
    std::vector<int> foundStamps;
    MoleculeStampSet::iterator i;
    for (i = moleculeStamps.begin(); i != moleculeStamps.end(); ++i)
      foundStamps.push_back((*i)->getIdent());

    // count_local holds the number of found stamps on this processor
    int count_local = foundStamps.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    std::vector<int> counts(nproc, 0);
    std::vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    if (totalCount > 0) {
      // we need a (possibly redundant) set of all found stamps:
      std::vector<int> fsGlobal(totalCount);

      // now spray out the foundStamps to all the other processors:
      MPI_Allgatherv(&foundStamps[0], count_local, MPI_INT, &fsGlobal[0],
                     &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

      std::vector<int>::iterator j;

      for (j = fsGlobal.begin(); j != fsGlobal.end(); ++j)
        moleculeStamps.insert(info_->getMoleculeStamp(*j));
    }
#endif

    return moleculeStamps;
  }